

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing.cpp
# Opt level: O2

int __thiscall ncnn::Packing::forward(Packing *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint _w;
  uint _h;
  uint _d;
  ulong uVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  size_t sVar15;
  ulong uVar16;
  int k;
  long lVar17;
  int k_1;
  ulong uVar18;
  long lVar19;
  Mat out;
  Mat m;
  
  iVar1 = bottom_blob->elempack;
  uVar18 = (ulong)iVar1;
  iVar6 = this->out_elempack;
  uVar16 = (ulong)iVar6;
  if (iVar1 == iVar6) {
LAB_00283d7f:
    Mat::operator=(top_blob,bottom_blob);
    goto switchD_00283dfd_default;
  }
  _w = bottom_blob->w;
  lVar4 = (long)(int)_w;
  _h = bottom_blob->h;
  _d = bottom_blob->d;
  iVar12 = bottom_blob->c;
  iVar13 = bottom_blob->dims;
  uVar2 = bottom_blob->elemsize;
  if (this->use_padding == 0) {
    if (iVar13 == 2) {
      if ((int)(iVar1 * _h) % iVar6 == 0) goto LAB_00284311;
    }
    else if (iVar13 == 1) {
      if ((int)(_w * iVar1) % iVar6 == 0) goto switchD_00283dfd_caseD_1;
    }
    else if ((1 < iVar13 - 3U) || ((iVar12 * iVar1) % iVar6 == 0)) goto code_r0x00283def;
    goto LAB_00283d7f;
  }
code_r0x00283def:
  switch(iVar13) {
  case 1:
switchD_00283dfd_caseD_1:
    if (iVar6 == 1) {
      Mat::operator=(top_blob,bottom_blob);
      top_blob->w = iVar1 * _w;
      top_blob->cstep = uVar18 * lVar4;
      top_blob->elemsize = uVar2 / uVar18;
      top_blob->elempack = this->out_elempack;
      return 0;
    }
    Mat::create(top_blob,(int)(iVar1 * _w + iVar6 + -1) / iVar6,uVar16 * (uVar2 / uVar18),iVar6,
                opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    memcpy(top_blob->data,bottom_blob->data,uVar2 * lVar4);
  default:
switchD_00283dfd_default:
    iVar6 = 0;
    break;
  case 2:
LAB_00284311:
    uVar7 = (long)(int)(iVar6 + iVar1 * _h + -1) / (long)iVar6;
    sVar15 = (uVar2 / uVar18) * uVar16;
    uVar16 = sVar15 / uVar16;
    iVar12 = (int)uVar7;
    Mat::create(top_blob,_w,iVar12,sVar15,iVar6,opt->blob_allocator);
    iVar6 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar18 = 0;
      if (0 < (int)_w) {
        uVar18 = (ulong)_w;
      }
      uVar7 = uVar7 & 0xffffffff;
      if (iVar12 < 1) {
        uVar7 = 0;
      }
      for (uVar11 = 0; iVar6 = 0, uVar11 != uVar7; uVar11 = uVar11 + 1) {
        pvVar3 = top_blob->data;
        for (uVar5 = 0; uVar5 != uVar18; uVar5 = uVar5 + 1) {
          for (lVar17 = 0; lVar17 < this->out_elempack; lVar17 = lVar17 + 1) {
            iVar6 = this->out_elempack * (int)uVar11 + (int)lVar17;
            iVar12 = iVar6 / iVar1;
            if ((int)_h <= iVar12) break;
            memcpy((void *)((long)pvVar3 +
                           uVar16 * lVar17 + sVar15 * uVar5 + sVar15 * lVar4 * uVar11),
                   (void *)((long)bottom_blob->data +
                           (long)(iVar6 % iVar1) * uVar16 + uVar2 * uVar5 +
                           (long)iVar12 * lVar4 * uVar2),uVar16);
          }
        }
      }
    }
    break;
  case 3:
    iVar13 = (iVar1 * iVar12 + iVar6 + -1) / iVar6;
    sVar15 = (uVar2 / uVar18) * uVar16;
    uVar16 = sVar15 / uVar16;
    Mat::create(top_blob,_w,_h,iVar13,sVar15,iVar6,opt->blob_allocator);
    iVar6 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar18 = 0;
      if (0 < (int)_w) {
        uVar18 = (ulong)_w;
      }
      uVar7 = (ulong)_h;
      if ((int)_h < 1) {
        uVar7 = 0;
      }
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      for (iVar9 = 0; iVar6 = 0, iVar9 != iVar13; iVar9 = iVar9 + 1) {
        Mat::channel(&out,top_blob,iVar9);
        for (uVar11 = 0; pvVar3 = out.data, uVar11 != uVar7; uVar11 = uVar11 + 1) {
          for (uVar5 = 0; uVar5 != uVar18; uVar5 = uVar5 + 1) {
            for (lVar17 = 0; lVar17 < this->out_elempack; lVar17 = lVar17 + 1) {
              iVar6 = this->out_elempack * iVar9 + (int)lVar17;
              iVar14 = iVar6 / iVar1;
              if (iVar12 <= iVar14) break;
              Mat::channel(&m,bottom_blob,iVar14);
              memcpy((void *)((long)pvVar3 +
                             uVar16 * lVar17 + sVar15 * uVar5 + uVar11 * lVar4 * sVar15),
                     (void *)((long)m.data +
                             (long)(iVar6 % iVar1) * uVar16 + uVar2 * uVar5 + uVar11 * lVar4 * uVar2
                             ),uVar16);
              Mat::~Mat(&m);
            }
          }
        }
        Mat::~Mat(&out);
      }
    }
    break;
  case 4:
    iVar13 = (iVar12 * iVar1 + iVar6 + -1) / iVar6;
    sVar15 = (uVar2 / uVar18) * uVar16;
    uVar16 = sVar15 / uVar16;
    Mat::create(top_blob,_w,_h,_d,iVar13,sVar15,iVar6,opt->blob_allocator);
    iVar6 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar18 = 0;
      if (0 < (int)_w) {
        uVar18 = (ulong)_w;
      }
      uVar7 = 0;
      if (0 < (int)_h) {
        uVar7 = (ulong)_h;
      }
      uVar11 = (ulong)_d;
      if ((int)_d < 1) {
        uVar11 = 0;
      }
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      for (iVar9 = 0; iVar6 = 0, iVar9 != iVar13; iVar9 = iVar9 + 1) {
        Mat::channel(&out,top_blob,iVar9);
        for (uVar5 = 0; uVar5 != uVar11; uVar5 = uVar5 + 1) {
          for (uVar10 = 0; pvVar3 = out.data, uVar10 != uVar7; uVar10 = uVar10 + 1) {
            lVar17 = (uVar5 * (long)(int)_h + uVar10) * lVar4;
            for (uVar8 = 0; uVar8 != uVar18; uVar8 = uVar8 + 1) {
              for (lVar19 = 0; lVar19 < this->out_elempack; lVar19 = lVar19 + 1) {
                iVar6 = this->out_elempack * iVar9 + (int)lVar19;
                iVar14 = iVar6 / iVar1;
                if (iVar12 <= iVar14) break;
                Mat::channel(&m,bottom_blob,iVar14);
                memcpy((void *)((long)pvVar3 + uVar16 * lVar19 + sVar15 * uVar8 + lVar17 * sVar15),
                       (void *)((long)m.data +
                               (long)(iVar6 % iVar1) * uVar16 + uVar2 * uVar8 + lVar17 * uVar2),
                       uVar16);
                Mat::~Mat(&m);
              }
            }
          }
        }
        Mat::~Mat(&out);
      }
    }
  }
  return iVar6;
}

Assistant:

int Packing::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        if (out_elempack == 1)
        {
            top_blob = bottom_blob;
            top_blob.w = w * elempack;
            top_blob.cstep = (size_t)w * elempack;
            top_blob.elemsize = elemsize / elempack;
            top_blob.elempack = out_elempack;
            return 0;
        }

        int outw = (w * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        memcpy(top_blob.data, bottom_blob.data, w * elemsize);

        return 0;
    }

    if (dims == 2)
    {
        int outh = (h * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < outh; i++)
        {
            unsigned char* outptr = (unsigned char*)top_blob + (size_t)i * w * out_elemsize;

            for (int j = 0; j < w; j++)
            {
                unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                for (int k = 0; k < out_elempack; k++)
                {
                    int srcy = (i * out_elempack + k) / elempack;
                    if (srcy >= h)
                        break;

                    int srck = (i * out_elempack + k) % elempack;

                    const unsigned char* ptr = (const unsigned char*)bottom_blob + (size_t)srcy * w * elemsize;
                    const unsigned char* elem_ptr = ptr + j * elemsize;

                    memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                }
            }
        }

        return 0;
    }

    if (dims == 3)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                unsigned char* outptr = (unsigned char*)out + (size_t)i * w * out_elemsize;

                for (int j = 0; j < w; j++)
                {
                    unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                    for (int k = 0; k < out_elempack; k++)
                    {
                        int srcq = (q * out_elempack + k) / elempack;
                        if (srcq >= channels)
                            break;

                        int srck = (q * out_elempack + k) % elempack;

                        const Mat m = bottom_blob.channel(srcq);
                        const unsigned char* ptr = (const unsigned char*)m + (size_t)i * w * elemsize;
                        const unsigned char* elem_ptr = ptr + j * elemsize;

                        memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                    }
                }
            }
        }

        return 0;
    }

    if (dims == 4)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int z = 0; z < d; z++)
            {
                for (int i = 0; i < h; i++)
                {
                    unsigned char* outptr = (unsigned char*)out + (size_t)(z * h + i) * w * out_elemsize;

                    for (int j = 0; j < w; j++)
                    {
                        unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                        for (int k = 0; k < out_elempack; k++)
                        {
                            int srcq = (q * out_elempack + k) / elempack;
                            if (srcq >= channels)
                                break;

                            int srck = (q * out_elempack + k) % elempack;

                            const Mat m = bottom_blob.channel(srcq);
                            const unsigned char* ptr = (const unsigned char*)m + (size_t)(z * h + i) * w * elemsize;
                            const unsigned char* elem_ptr = ptr + j * elemsize;

                            memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                        }
                    }
                }
            }
        }

        return 0;
    }

    return 0;
}